

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall polyscope::Histogram::fillBuffers(Histogram *this)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  element_type *peVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  double rightY;
  double leftY;
  double rightX;
  double leftX;
  size_t i;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  coords;
  bool smoothBins;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> histCurveX;
  vector<double,_std::allocator<double>_> histCurveY;
  value_type *in_stack_fffffffffffffe68;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffffe70;
  element_type *in_stack_fffffffffffffe80;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [16];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  vec<2,float,(glm::qualifier)0> local_e8 [8];
  vec<2,float,(glm::qualifier)0> local_e0 [8];
  vec<2,float,(glm::qualifier)0> local_d8 [8];
  vec<2,float,(glm::qualifier)0> local_d0 [8];
  vec<2,float,(glm::qualifier)0> local_c8 [8];
  vec<2,float,(glm::qualifier)0> local_c0 [8];
  double local_b8;
  double local_b0;
  value_type_conflict2 local_a8;
  value_type_conflict2 local_a0;
  ulong local_98;
  undefined4 local_90;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [47];
  byte local_39;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x418ef9);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x418f06)
  ;
  local_39 = 0;
  if ((*(byte *)(in_RDI + 0xc2) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               in_stack_ffffffffffffff10,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               in_stack_ffffffffffffff08);
  }
  else {
    if ((*(byte *)(in_RDI + 0xc1) & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      std::vector<double,_std::allocator<double>_>::operator=
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               in_stack_ffffffffffffff10,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               in_stack_ffffffffffffff08);
    local_39 = 1;
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)0x419005);
  sVar3 = geometrycentral::surface::std::vector<double,_std::allocator<double>_>::size(&local_20);
  if (sVar3 == 0) {
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x41902d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"a_coord",&local_89);
    (*peVar4->_vptr_ShaderProgram[0xf])(peVar4,local_88,local_68,0,0,0xffffffff);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_90 = 1;
  }
  else {
    for (local_98 = 0; uVar2 = local_98,
        sVar3 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                size(&local_38), uVar2 < sVar3; local_98 = local_98 + 1) {
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&local_38,local_98);
      pvVar5 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      local_a0 = *pvVar5;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (&local_38,local_98);
      pvVar5 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
      local_a8 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_20,local_98);
      local_b0 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_20,local_98);
      local_b8 = *pvVar6;
      if ((local_39 & 1) != 0) {
        if (local_98 != 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_20,local_98 - 1);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_20,local_98);
          local_b0 = (dVar1 + *pvVar6) * 0.5;
        }
        uVar2 = local_98;
        sVar3 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                size(&local_38);
        if (uVar2 < sVar3 - 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_20,local_98);
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&local_20,local_98 + 1);
          local_b8 = (dVar1 + *pvVar6) * 0.5;
        }
      }
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_c0,local_a0,0.0);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_c8,local_a8,0.0);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_d0,local_a0,local_b0);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_d8,local_a8,0.0);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_e0,local_a8,local_b8);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      glm::vec<2,float,(glm::qualifier)0>::vec<double,double>(local_e8,local_a0,local_b0);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::push_back(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    in_stack_fffffffffffffe80 =
         std::
         __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x419450);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"a_coord",&local_109);
    (*in_stack_fffffffffffffe80->_vptr_ShaderProgram[0xf])
              (in_stack_fffffffffffffe80,local_108,local_68,0,0,0xffffffff);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4194d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"t_colormap",&local_131);
    (*peVar4->_vptr_ShaderProgram[0x19])(peVar4,local_130,in_RDI + 0x100,1);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    *(byte *)(in_RDI + 0xc3) = *(byte *)(in_RDI + 0xc1) & 1;
    *(byte *)(in_RDI + 0xc4) = *(byte *)(in_RDI + 0xc2) & 1;
    local_90 = 0;
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffffe80);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             in_stack_fffffffffffffe80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void Histogram::fillBuffers() {

  // Fill from proper curve depending on current settings
  // (does unecessary copy as written)
  std::vector<double> histCurveY;
  std::vector<std::array<double, 2>> histCurveX;
  bool smoothBins = false; // draw trapezoids rather than rectangles
  if (useSmoothed) {
    if (useWeighted) {
      histCurveY = weightedSmoothedHistCurveY;
    } else {
      histCurveY = unweightedSmoothedHistCurveY;
    }
    histCurveX = smoothedHistCurveX;
    smoothBins = true;
  } else {
    if (useWeighted) {
      histCurveY = weightedRawHistCurveY;
    } else {
      histCurveY = unweightedRawHistCurveY;
    }
    histCurveX = rawHistCurveX;
  }

  // Push to buffer
  std::vector<glm::vec2> coords;

  if (histCurveY.size() == 0) {
    program->setAttribute("a_coord", coords);
    return;
  }

  // Extra first triangle
  for (size_t i = 0; i < histCurveX.size(); i++) {

    double leftX = histCurveX[i][0];
    double rightX = histCurveX[i][1];

    double leftY = histCurveY[i];
    double rightY = histCurveY[i];
    if (smoothBins) {
      if (i > 0) {
        leftY = 0.5 * (histCurveY[i - 1] + histCurveY[i]);
      }
      if (i < histCurveX.size() - 1) {
        rightY = 0.5 * (histCurveY[i] + histCurveY[i + 1]);
      }
    }

    // = Lower triangle (lower left, lower right, upper left)
    coords.push_back(glm::vec2{leftX, 0.0});
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{leftX, leftY});

    // = Upper triangle (lower right, upper right, upper left)
    coords.push_back(glm::vec2{rightX, 0.0});
    coords.push_back(glm::vec2{rightX, rightY});
    coords.push_back(glm::vec2{leftX, leftY});
  }

  program->setAttribute("a_coord", coords);
  program->setTextureFromColormap("t_colormap", colormap, true);

  // Update current buffer settings
  currBufferWeighted = useWeighted;
  currBufferSmoothed = useSmoothed;
}